

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O1

String * doctest::operator+(String *__return_storage_ptr__,String *lhs,String *rhs)

{
  char *pcVar1;
  anon_union_24_2_13149d16_for_String_2 local_38;
  
  if ((lhs->field_0).buf[0x17] < '\0') {
    pcVar1 = String::allocate((String *)&local_38.data,(lhs->field_0).data.size);
    memcpy(pcVar1,(lhs->field_0).data.ptr,(ulong)(lhs->field_0).data.size);
  }
  else {
    local_38._16_8_ = *(long *)((long)&lhs->field_0 + 0x10);
    local_38.data.ptr = (lhs->field_0).data.ptr;
    local_38._8_8_ = *(ulong *)((long)&lhs->field_0 + 8);
  }
  String::operator+=((String *)&local_38.data,rhs);
  if ((long)local_38._16_8_ < 0) {
    pcVar1 = String::allocate(__return_storage_ptr__,local_38.data.size);
    memcpy(pcVar1,local_38.data.ptr,local_38._8_8_ & 0xffffffff);
  }
  else {
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 0x10) = local_38._16_8_;
    (__return_storage_ptr__->field_0).data.ptr = local_38.data.ptr;
    *(undefined8 *)((long)&__return_storage_ptr__->field_0 + 8) = local_38._8_8_;
  }
  if (((long)local_38._16_8_ < 0) && (local_38.data.ptr != (char *)0x0)) {
    operator_delete__(local_38.data.ptr);
  }
  return __return_storage_ptr__;
}

Assistant:

String operator+(const String& lhs, const String& rhs) { return  String(lhs) += rhs; }